

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

void __thiscall
MT32Emu::RendererImpl<short>::doRenderAndConvertStreams<float>
          (RendererImpl<short> *this,DACOutputStreams<float> *streams,Bit32u len)

{
  Bit32u local_c09c;
  undefined1 local_c088 [4];
  Bit32u thisPassLen;
  DACOutputStreams<float> tmpStreams;
  DACOutputStreams<short> cnvStreams;
  short cnvReverbWetRight [4096];
  short cnvReverbWetLeft [4096];
  short cnvReverbDryRight [4096];
  short cnvReverbDryLeft [4096];
  short cnvNonReverbRight [4096];
  short cnvNonReverbLeft [4096];
  uint local_1c;
  Bit32u len_local;
  DACOutputStreams<float> *streams_local;
  RendererImpl<short> *this_local;
  
  tmpStreams.reverbWetRight = (float *)(cnvNonReverbRight + 0xffc);
  cnvStreams.nonReverbLeft = cnvReverbDryLeft + 0xffc;
  cnvStreams.nonReverbRight = cnvReverbDryRight + 0xffc;
  cnvStreams.reverbDryLeft = cnvReverbWetLeft + 0xffc;
  cnvStreams.reverbDryRight = cnvReverbWetRight + 0xffc;
  cnvStreams.reverbWetLeft = (short *)&cnvStreams.reverbWetRight;
  memcpy(local_c088,streams,0x30);
  for (local_1c = len; local_1c != 0; local_1c = local_1c - local_c09c) {
    if (local_1c < 0x1001) {
      local_c09c = local_1c;
    }
    else {
      local_c09c = 0x1000;
    }
    doRenderStreams(this,(DACOutputStreams<short> *)&tmpStreams.reverbWetRight,local_c09c);
    convertStreamsFormat<short,float>
              ((DACOutputStreams<short> *)&tmpStreams.reverbWetRight,
               (DACOutputStreams<float> *)local_c088,local_c09c);
    advanceStreams<float>((DACOutputStreams<float> *)local_c088,local_c09c);
  }
  return;
}

Assistant:

void RendererImpl<Sample>::doRenderAndConvertStreams(const DACOutputStreams<O> &streams, Bit32u len) {
	Sample cnvNonReverbLeft[MAX_SAMPLES_PER_RUN], cnvNonReverbRight[MAX_SAMPLES_PER_RUN];
	Sample cnvReverbDryLeft[MAX_SAMPLES_PER_RUN], cnvReverbDryRight[MAX_SAMPLES_PER_RUN];
	Sample cnvReverbWetLeft[MAX_SAMPLES_PER_RUN], cnvReverbWetRight[MAX_SAMPLES_PER_RUN];

	const DACOutputStreams<Sample> cnvStreams = {
		cnvNonReverbLeft, cnvNonReverbRight,
		cnvReverbDryLeft, cnvReverbDryRight,
		cnvReverbWetLeft, cnvReverbWetRight
	};

	DACOutputStreams<O> tmpStreams = streams;

	while (len > 0) {
		Bit32u thisPassLen = len > MAX_SAMPLES_PER_RUN ? MAX_SAMPLES_PER_RUN : len;
		doRenderStreams(cnvStreams, thisPassLen);
		convertStreamsFormat(cnvStreams, tmpStreams, thisPassLen);
		advanceStreams(tmpStreams, thisPassLen);
		len -= thisPassLen;
	}
}